

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O2

bool __thiscall
cmELFInternalImpl<cmELFTypes64>::LoadSectionHeader(cmELFInternalImpl<cmELFTypes64> *this,uint i)

{
  bool bVar1;
  
  std::istream::seekg((this->super_cmELFInternal).Stream._M_t.
                      super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl,
                      (ulong)((this->ELFHeader).e_shentsize * i) + (this->ELFHeader).e_shoff,0);
  bVar1 = Read(this,(this->SectionHeaders).
                    super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>._M_impl.
                    super__Vector_impl_data._M_start + i);
  if ((bVar1) &&
     ((this->SectionHeaders).super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>._M_impl.
      super__Vector_impl_data._M_start[i].sh_type == 6)) {
    (this->super_cmELFInternal).DynamicSectionIndex = i;
  }
  return bVar1;
}

Assistant:

bool LoadSectionHeader(unsigned int i)
  {
    // Read the section header from the file.
    this->Stream->seekg(this->ELFHeader.e_shoff +
                        this->ELFHeader.e_shentsize * i);
    if (!this->Read(this->SectionHeaders[i])) {
      return false;
    }

    // Identify some important sections.
    if (this->SectionHeaders[i].sh_type == SHT_DYNAMIC) {
      this->DynamicSectionIndex = static_cast<int>(i);
    }
    return true;
  }